

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usertimer.cpp
# Opt level: O2

time_t __thiscall soplex::UserTimer::time(UserTimer *this,time_t *__timer)

{
  long lVar1;
  
  if ((this->super_Timer).status == RUNNING) {
    updateTicks(this);
    lVar1 = this->uAccount + this->uTicks;
  }
  else {
    lVar1 = this->uAccount;
  }
  this->lasttime = (((double)lVar1 * 1000.0) / (double)ticks_per_sec) / 1000.0;
  return lVar1;
}

Assistant:

Real UserTimer::time() const
{
   if(status == RUNNING)
   {
      updateTicks();
      lasttime = ticks2sec(uTicks + uAccount);
   }
   else
   {
      lasttime = ticks2sec(uAccount);
   }

   return lasttime;
}